

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createBinaryComparisonOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  size_type sVar1;
  const_reference ppIVar2;
  undefined4 in_EDX;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *in_RSI;
  BinaryComparisonExpression *expression;
  Operator mmlOp;
  BinaryComparisonExpression *in_stack_ffffffffffffffb0;
  INode *pIVar3;
  uint local_20;
  INode *local_8;
  
  sVar1 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size(in_RSI);
  if (sVar1 == 2) {
    switch(in_EDX) {
    case 8:
      local_20 = 0;
      break;
    case 9:
      local_20 = 1;
      break;
    case 10:
      local_20 = 4;
      break;
    case 0xb:
      local_20 = 2;
      break;
    case 0xc:
      local_20 = 5;
      break;
    case 0xd:
      local_20 = 3;
      break;
    default:
      return (INode *)0x0;
    }
    local_8 = (INode *)operator_new(0x20);
    MathML::AST::BinaryComparisonExpression::BinaryComparisonExpression(in_stack_ffffffffffffffb0);
    (*local_8->_vptr_INode[6])(local_8,(ulong)local_20);
    ppIVar2 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                        (in_RSI,0);
    (*local_8->_vptr_INode[10])(local_8,*ppIVar2);
    pIVar3 = local_8;
    ppIVar2 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                        (in_RSI,1);
    (*pIVar3->_vptr_INode[0xc])(pIVar3,*ppIVar2);
  }
  else {
    local_8 = (INode *)0x0;
  }
  return local_8;
}

Assistant:

MathML::AST::INode* FormulasLoader::createBinaryComparisonOperation( const NodeVector& nodes, Operator op )
	{
		if ( nodes.size() != 2 )
		{
			// TODO error handling
			return 0;
		}

		MathML::AST::BinaryComparisonExpression::Operator mmlOp;
		switch ( op )
		{
		case EQ:
			mmlOp = MathML::AST::BinaryComparisonExpression::EQ;
			break;
		case NEQ:
			mmlOp = MathML::AST::BinaryComparisonExpression::NEQ;
			break;
		case LT:
			mmlOp = MathML::AST::BinaryComparisonExpression::LT;
			break;
		case LTE:
			mmlOp = MathML::AST::BinaryComparisonExpression::LTE;
			break;
		case GT:
			mmlOp = MathML::AST::BinaryComparisonExpression::GT;
			break;
		case GTE:
			mmlOp = MathML::AST::BinaryComparisonExpression::GTE;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::BinaryComparisonExpression* expression = new MathML::AST::BinaryComparisonExpression();
		expression->setOperator( mmlOp );
		expression->setLeftOperand( nodes[ 0 ] );
		expression->setRightOperand( nodes[ 1 ] );

		return expression;
	}